

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O0

void sys_vgui(char *fmt,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  bool local_111;
  int local_110;
  undefined1 local_108 [8];
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  uint local_4c;
  char *pcStack_48;
  int colorize;
  char *mess;
  int newsize;
  int msglen2;
  va_list ap;
  int nwrote;
  int headwas;
  int bytesleft;
  int msglen;
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_100 = in_RSI;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  iVar1 = sys_havegui();
  if (iVar1 != 0) {
    if ((pd_maininstance.pd_inter)->i_guibuf == (char *)0x0) {
      pcVar2 = (char *)malloc(0x2000);
      (pd_maininstance.pd_inter)->i_guibuf = pcVar2;
      if (pcVar2 == (char *)0x0) {
        fprintf(_stderr,"Pd: couldn\'t allocate GUI buffer\n");
        sys_bail(1);
      }
      (pd_maininstance.pd_inter)->i_guisize = 0x2000;
      (pd_maininstance.pd_inter)->i_guitail = 0;
      (pd_maininstance.pd_inter)->i_guihead = 0;
    }
    if ((pd_maininstance.pd_inter)->i_guisize + -0x1000 < (pd_maininstance.pd_inter)->i_guihead) {
      sys_trytogetmoreguibuf((pd_maininstance.pd_inter)->i_guisize + 0x2000);
    }
    ap[0].overflow_arg_area = local_108;
    ap[0]._0_8_ = &stack0x00000008;
    msglen2 = 0x30;
    newsize = 8;
    headwas = vsnprintf((pd_maininstance.pd_inter)->i_guibuf + (pd_maininstance.pd_inter)->i_guihead
                        ,(long)((pd_maininstance.pd_inter)->i_guisize -
                               (pd_maininstance.pd_inter)->i_guihead),fmt,&newsize);
    if (headwas < 0) {
      fprintf(_stderr,"Pd: buffer space wasn\'t sufficient for long GUI string\n");
    }
    else {
      if ((pd_maininstance.pd_inter)->i_guisize - (pd_maininstance.pd_inter)->i_guihead <= headwas)
      {
        local_110 = headwas;
        if (headwas < 0x2001) {
          local_110 = 0x2000;
        }
        mess._0_4_ = (pd_maininstance.pd_inter)->i_guisize + 1 + local_110;
        sys_trytogetmoreguibuf((int)mess);
        ap[0].overflow_arg_area = local_108;
        ap[0]._0_8_ = &stack0x00000008;
        msglen2 = 0x30;
        newsize = 8;
        mess._4_4_ = vsnprintf((pd_maininstance.pd_inter)->i_guibuf +
                               (pd_maininstance.pd_inter)->i_guihead,
                               (long)((pd_maininstance.pd_inter)->i_guisize -
                                     (pd_maininstance.pd_inter)->i_guihead),fmt,&newsize);
        if (mess._4_4_ != headwas) {
          bug("sys_vgui");
        }
        if ((pd_maininstance.pd_inter)->i_guisize - (pd_maininstance.pd_inter)->i_guihead <= headwas
           ) {
          headwas = (pd_maininstance.pd_inter)->i_guisize - (pd_maininstance.pd_inter)->i_guihead;
        }
      }
      if ((sys_debuglevel & 1U) != 0) {
        pcStack_48 = (pd_maininstance.pd_inter)->i_guibuf + (pd_maininstance.pd_inter)->i_guihead;
        local_111 = stderr_isatty != 0 && (sys_debuglevel & 4U) != 0;
        local_4c = (uint)local_111;
        if (local_4c == 0) {
          pcVar2 = "";
          if (sys_vgui::newmess != 0) {
            pcVar2 = ">> ";
          }
          fprintf(_stderr,"%s%s",pcVar2,pcStack_48);
        }
        else {
          pcVar2 = "";
          if (sys_vgui::newmess != 0) {
            pcVar2 = ">> ";
          }
          fprintf(_stderr,"\x1b[0;1;35m%s%s\x1b[0m",pcVar2,pcStack_48);
        }
        sys_vgui::newmess = (int)(pcStack_48[headwas + -1] == '\n');
      }
      (pd_maininstance.pd_inter)->i_guihead = headwas + (pd_maininstance.pd_inter)->i_guihead;
      (pd_maininstance.pd_inter)->i_bytessincelastping =
           headwas + (pd_maininstance.pd_inter)->i_bytessincelastping;
    }
  }
  return;
}

Assistant:

void sys_vgui(const char *fmt, ...)
{
    int msglen, bytesleft, headwas, nwrote;
    va_list ap;

    if (!sys_havegui())
        return;
    if (!INTER->i_guibuf)
    {
        if (!(INTER->i_guibuf = malloc(GUI_ALLOCCHUNK)))
        {
            fprintf(stderr, "Pd: couldn't allocate GUI buffer\n");
            sys_bail(1);
        }
        INTER->i_guisize = GUI_ALLOCCHUNK;
        INTER->i_guihead = INTER->i_guitail = 0;
    }
    if (INTER->i_guihead > INTER->i_guisize - (GUI_ALLOCCHUNK/2)) {
            sys_trytogetmoreguibuf(INTER->i_guisize + GUI_ALLOCCHUNK);
    }
    va_start(ap, fmt);
    msglen = vsnprintf(
        INTER->i_guibuf  + INTER->i_guihead,
        INTER->i_guisize - INTER->i_guihead,
        fmt, ap);
    va_end(ap);
    if(msglen < 0)
    {
        fprintf(stderr,
            "Pd: buffer space wasn't sufficient for long GUI string\n");
        return;
    }
    if (msglen >= INTER->i_guisize - INTER->i_guihead)
    {
        int msglen2, newsize =
            INTER->i_guisize
            + 1
            + (msglen > GUI_ALLOCCHUNK ? msglen : GUI_ALLOCCHUNK);
        sys_trytogetmoreguibuf(newsize);

        va_start(ap, fmt);
        msglen2 = vsnprintf(
            INTER->i_guibuf  + INTER->i_guihead,
            INTER->i_guisize - INTER->i_guihead,
            fmt, ap);
        va_end(ap);
        if (msglen2 != msglen)
            bug("sys_vgui");
        if (msglen >= INTER->i_guisize - INTER->i_guihead)
            msglen  = INTER->i_guisize - INTER->i_guihead;
    }
    if (sys_debuglevel & DEBUG_MESSUP)
    {
        const char *mess = INTER->i_guibuf + INTER->i_guihead;
        int colorize = stderr_isatty && (sys_debuglevel & DEBUG_COLORIZE);
        static int newmess = 1;
#ifdef _WIN32
    #ifdef _MSC_VER
        fwprintf(stderr, L"%S", mess);
    #else
        fwprintf(stderr, L"%s", mess);
    #endif
        fflush(stderr);
#else
        if (colorize)
            fprintf(stderr, "\e[0;1;35m%s%s\e[0m", (newmess)?">> ":"", mess);
        else
            fprintf(stderr, "%s%s", (newmess)?">> ":"", mess);

        newmess = ('\n' == mess[msglen-1]);
#endif
    }
    INTER->i_guihead += msglen;
    INTER->i_bytessincelastping += msglen;
}